

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdata.cpp
# Opt level: O3

uint32_t __thiscall
icu_63::CollationData::getLastPrimaryForGroup(CollationData *this,int32_t script)

{
  uint32_t uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  if (-1 < script) {
    if (script < this->numScripts) {
      uVar2 = (ulong)(uint)script;
    }
    else {
      if ((script & 0x7ffffff8U) != 0x1000) {
        return 0;
      }
      uVar2 = (ulong)(this->numScripts + script + -0x1000);
    }
    uVar1 = 0;
    if ((ulong)this->scriptsIndex[uVar2] != 0) {
      uVar1 = (uint)this->scriptStarts[(ulong)this->scriptsIndex[uVar2] + 1] * 0x10000 - 1;
    }
  }
  return uVar1;
}

Assistant:

uint32_t
CollationData::getLastPrimaryForGroup(int32_t script) const {
    int32_t index = getScriptIndex(script);
    if(index == 0) {
        return 0;
    }
    uint32_t limit = scriptStarts[index + 1];
    return (limit << 16) - 1;
}